

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::print(JSPrinter *this,Ref node)

{
  ulong uVar1;
  Ref *pRVar2;
  char *pcVar3;
  size_t *psVar4;
  JSPrinter *this_00;
  JSPrinter *this_01;
  Ref local_20;
  Ref node_local;
  ulong uVar5;
  
  local_20.inst = node.inst;
  ensure(this,100);
  switch((node.inst)->type) {
  case String:
    printName(this,node);
    return;
  case Number:
    printNum(this,node);
    return;
  case Assign_:
    printAssign(this,node);
    return;
  case AssignName_:
    printAssignName(this,node);
    return;
  }
  psVar4 = (size_t *)0x0;
  pRVar2 = Ref::operator[](&local_20,0);
  if (pRVar2->inst->type != String) {
    __assert_fail("isString()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0xef,"IString &cashew::Value::getIString()");
  }
  this_00 = (JSPrinter *)(pRVar2->inst->field_1).str.str._M_str;
  switch(this_00->pretty) {
  case true:
    if (this_00 != DAT_010b1740) {
LAB_00d0d5fa:
      abort();
    }
    printArray(this,local_20);
    break;
  case true:
    if (this_00 == DAT_010b12b0) {
      printBinary(this,local_20);
    }
    else if (this_00 == DAT_010b1270) {
      printBlock(this,local_20);
    }
    else {
      if (this_00 != DAT_010b1360) goto LAB_00d0d5fa;
      printBreak(this,local_20);
    }
    break;
  case true:
    if (this_00 == DAT_010b1340) {
      printCall(this,local_20);
    }
    else if (this_00 == DAT_010b12a0) {
      printConditional(this,local_20);
    }
    else {
      if (this_00 != DAT_010b1370) goto LAB_00d0d5fa;
      printContinue(this,local_20);
    }
    break;
  case true:
    if (this_00 == DAT_010b1260) {
      printDefun(this,local_20);
    }
    else if (this_00 == DAT_010b1300) {
      printDo(this,local_20);
    }
    else {
      if (this_00 != DAT_010b1710) goto LAB_00d0d5fa;
      printDot(this,local_20);
    }
    break;
  default:
    print(this_00);
    if (this_00->size < this_00->used + (long)(int)psVar4) {
      uVar1 = this_00->size * 2;
      uVar5 = 0x400;
      if (0x400 < uVar1) {
        uVar5 = uVar1;
      }
      this_01 = (JSPrinter *)(uVar5 + (long)(int)psVar4);
      this_00->size = (size_t)this_01;
      if (this_00->buffer == (char *)0x0) {
        pcVar3 = (char *)malloc((size_t)this_01);
        this_00->buffer = pcVar3;
        if (pcVar3 == (char *)0x0) goto LAB_00d0d688;
      }
      else {
        pcVar3 = (char *)realloc(this_00->buffer,(size_t)this_01);
        if (pcVar3 == (char *)0x0) {
          psVar4 = &this_00->size;
          ensure();
LAB_00d0d688:
          ensure(this_01);
          if ((int)*psVar4 == 0) {
            emit(this_01,(char *)psVar4[2]);
            return;
          }
          __assert_fail("isString()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                        ,0xeb,"const char *cashew::Value::getCString()");
        }
        this_00->buffer = pcVar3;
      }
    }
    return;
  case true:
    if (this_00 != DAT_010b12d0) goto LAB_00d0d5fa;
    printIf(this,local_20);
    break;
  case true:
    if (this_00 != DAT_010b1350) goto LAB_00d0d5fa;
    printLabel(this,local_20);
    break;
  case true:
    if (this_00 != DAT_010b1730) goto LAB_00d0d5fa;
    printNew(this,local_20);
    break;
  case true:
    if (this_00 == DAT_010b1750) {
      printObject(this,local_20);
    }
    break;
  case true:
    if (this_00 != DAT_010b12c0) goto LAB_00d0d5fa;
    printReturn(this,local_20);
    break;
  case true:
    if (this_00 == DAT_010b1330) {
      printSub(this,local_20);
    }
    else if (this_00 == DAT_010b1320) {
      printSeq(this,local_20);
    }
    else if (this_00 == DAT_010b1380) {
      printSwitch(this,local_20);
    }
    else {
      if (this_00 != DAT_010b1390) goto LAB_00d0d5fa;
      printString(this,local_20);
    }
    break;
  case true:
    if (this_00 == DAT_010b1250) {
      printToplevel(this,local_20);
    }
    else {
      if (this_00 != DAT_010b13a0) goto LAB_00d0d5fa;
      printTry(this,local_20);
    }
    break;
  case true:
    if (this_00 != DAT_010b13f0) goto LAB_00d0d5fa;
    printUnaryPrefix(this,local_20);
    break;
  case true:
    if (this_00 != DAT_010b1280) goto LAB_00d0d5fa;
    printVar(this,local_20);
    break;
  case true:
    if (this_00 != DAT_010b12f0) goto LAB_00d0d5fa;
    printWhile(this,local_20);
  }
  return;
}

Assistant:

void print(Ref node) {
    ensure();
    if (node->isString()) {
      printName(node);
      return;
    }
    if (node->isNumber()) {
      printNum(node);
      return;
    }
    if (node->isAssignName()) {
      printAssignName(node);
      return;
    }
    if (node->isAssign()) {
      printAssign(node);
      return;
    }
    IString type = node[0]->getIString();
    switch (type.str[0]) {
      case 'a': {
        if (type == ARRAY) {
          printArray(node);
        } else {
          abort();
        }
        break;
      }
      case 'b': {
        if (type == BINARY) {
          printBinary(node);
        } else if (type == BLOCK) {
          printBlock(node);
        } else if (type == BREAK) {
          printBreak(node);
        } else {
          abort();
        }
        break;
      }
      case 'c': {
        if (type == CALL) {
          printCall(node);
        } else if (type == CONDITIONAL) {
          printConditional(node);
        } else if (type == CONTINUE) {
          printContinue(node);
        } else {
          abort();
        }
        break;
      }
      case 'd': {
        if (type == DEFUN) {
          printDefun(node);
        } else if (type == DO) {
          printDo(node);
        } else if (type == DOT) {
          printDot(node);
        } else {
          abort();
        }
        break;
      }
      case 'i': {
        if (type == IF) {
          printIf(node);
        } else {
          abort();
        }
        break;
      }
      case 'l': {
        if (type == LABEL) {
          printLabel(node);
        } else {
          abort();
        }
        break;
      }
      case 'n': {
        if (type == NEW) {
          printNew(node);
        } else {
          abort();
        }
        break;
      }
      case 'o': {
        if (type == OBJECT) {
          printObject(node);
        }
        break;
      }
      case 'r': {
        if (type == RETURN) {
          printReturn(node);
        } else {
          abort();
        }
        break;
      }
      case 's': {
        if (type == SUB) {
          printSub(node);
        } else if (type == SEQ) {
          printSeq(node);
        } else if (type == SWITCH) {
          printSwitch(node);
        } else if (type == STRING) {
          printString(node);
        } else {
          abort();
        }
        break;
      }
      case 't': {
        if (type == TOPLEVEL) {
          printToplevel(node);
        } else if (type == TRY) {
          printTry(node);
        } else {
          abort();
        }
        break;
      }
      case 'u': {
        if (type == UNARY_PREFIX) {
          printUnaryPrefix(node);
        } else {
          abort();
        }
        break;
      }
      case 'v': {
        if (type == VAR) {
          printVar(node);
        } else {
          abort();
        }
        break;
      }
      case 'w': {
        if (type == WHILE) {
          printWhile(node);
        } else {
          abort();
        }
        break;
      }
      default: {
        errv("cannot yet print %s\n", type.str.data());
        abort();
      }
    }
  }